

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O0

int64_t __thiscall
disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>::
ApplyWaitMethod(SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1> *this
               ,int64_t counter)

{
  long in_RSI;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_00000010;
  int local_1c;
  duration<long,std::ratio<1l,1000l>> local_18 [8];
  long local_10;
  
  local_10 = in_RSI;
  if (in_RSI < 0x65) {
    if (in_RSI < 1) {
      local_1c = 1;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_18,&local_1c);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_00000010);
    }
    else {
      local_10 = in_RSI + -1;
      std::this_thread::yield();
    }
  }
  else {
    SpinPause();
    local_10 = local_10 + -1;
  }
  return local_10;
}

Assistant:

inline int64_t ApplyWaitMethod(int64_t counter) {
    if (counter > (S / 2)) {
      SpinPause();
      --counter;
    } else if (counter > 0) {
      --counter;
      std::this_thread::yield();
    } else {
      std::this_thread::sleep_for(D(DV));
    }

    return counter;
  }